

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O0

void free_dungeon(void)

{
  branch *pbVar1;
  branch *next;
  branch *curr;
  
  next = branches;
  while (next != (branch *)0x0) {
    pbVar1 = next->next;
    free(next);
    next = pbVar1;
  }
  branches = (branch *)0x0;
  freelevchn();
  return;
}

Assistant:

void free_dungeon(void)
{
    branch *curr, *next;
    
    for (curr = branches; curr; curr = next) {
	next = curr->next;
	free(curr);
    }
    branches = NULL;
    
    freelevchn();
}